

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
::scan_comment(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
               *this)

{
  char_int_type cVar1;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
  *this_local;
  
  cVar1 = get(this);
  if (cVar1 == 0x2a) {
    while (cVar1 = get(this), 1 < cVar1 + 1U) {
      if (cVar1 == 0x2a) {
        cVar1 = get(this);
        if (cVar1 == 0x2f) {
          return true;
        }
        unget(this);
      }
    }
    this->error_message = "invalid comment; missing closing \'*/\'";
    this_local._7_1_ = false;
  }
  else if (cVar1 == 0x2f) {
    do {
      cVar1 = get(this);
      if ((cVar1 + 1U < 2) || (cVar1 == 10)) break;
    } while (cVar1 != 0xd);
    this_local._7_1_ = true;
  }
  else {
    this->error_message = "invalid comment; expecting \'/\' or \'*\' after \'/\'";
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool scan_comment()
{
switch (get())
{
// single-line comments skip input until a newline or EOF is read
case '/':
{
while (true)
{
switch (get())
{
case '\n':
case '\r':
case std::char_traits<char_type>::eof():
case '\0':
return true;

default:
break;
}
}
}

// multi-line comments skip input until */ is read
case '*':
{
while (true)
{
switch (get())
{
case std::char_traits<char_type>::eof():
case '\0':
{
error_message = "invalid comment; missing closing '*/'";
return false;
}

case '*':
{
switch (get())
{
case '/':
return true;

default:
{
unget();
continue;
}
}
}

default:
continue;
}
}
}

// unexpected character after reading '/'
default:
{
error_message = "invalid comment; expecting '/' or '*' after '/'";
return false;
}
}
}